

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

bool __thiscall
QScrollerPrivate::moveWhilePressed(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  QScrollerPropertiesPrivate *pQVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long in_FS_OFFSET;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  QPointF QVar13;
  QPointF local_58;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->properties).d.d;
  QVar13 = QScroller::pixelPerMeter(this->q_ptr);
  local_48.xp = position->xp - (this->pressPosition).xp;
  local_48.yp = position->yp - (this->pressPosition).yp;
  auVar12 = divpd((undefined1  [16])local_48,(undefined1  [16])QVar13);
  dVar10 = auVar12._0_8_;
  dVar8 = auVar12._8_8_;
  uVar5 = -(ulong)(dVar10 < -dVar10);
  uVar7 = -(ulong)(dVar8 < -dVar8);
  uVar6 = (ulong)-dVar8 & uVar7;
  auVar9._0_8_ = ~uVar5 & (ulong)dVar10;
  auVar9._8_8_ = ~uVar7 & (ulong)dVar8;
  auVar12._8_4_ = (int)uVar6;
  auVar12._0_8_ = (ulong)-dVar10 & uVar5;
  auVar12._12_4_ = (int)(uVar6 >> 0x20);
  dVar8 = SUB168(auVar9 | auVar12,0);
  dVar10 = SUB168(auVar9 | auVar12,8);
  dVar11 = dVar8 + dVar10;
  bVar3 = dVar11 != pQVar1->dragStartDistance;
  bVar2 = pQVar1->dragStartDistance <= dVar11;
  bVar4 = bVar2 && bVar3;
  if (bVar2 && bVar3) {
    if (((&pQVar1->hOvershootPolicy)[dVar8 < dVar10] == OvershootAlwaysOn) ||
       (0.0 < (&(this->contentPosRange).w)[dVar8 < dVar10])) {
      setState(this,Dragging);
      uVar6 = -(ulong)(local_48.xp < -local_48.xp);
      uVar5 = -(ulong)(local_48.yp < -local_48.yp);
      dVar8 = pQVar1->dragStartDistance /
              ((double)(~uVar5 & (ulong)local_48.yp | (ulong)-local_48.yp & uVar5) +
              (double)(~uVar6 & (ulong)local_48.xp | (ulong)-local_48.xp & uVar6));
      dVar10 = local_48.yp - dVar8 * local_48.yp;
      local_48.yp._0_4_ = SUB84(dVar10,0);
      local_48.xp = local_48.xp - dVar8 * local_48.xp;
      local_48.yp._4_4_ = (int)((ulong)dVar10 >> 0x20);
      local_58.xp = 0.0;
      local_58.yp = 0.0;
      bVar3 = qFuzzyCompare(&local_48,&local_58);
      bVar4 = true;
      if (!bVar3) {
        local_58.xp = (this->pressPosition).xp + local_48.xp;
        local_58.yp = (this->pressPosition).yp + local_48.yp;
        handleDrag(this,&local_58,timestamp);
      }
    }
    else {
      bVar4 = false;
      setState(this,Inactive);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QScrollerPrivate::moveWhilePressed(const QPointF &position, qint64 timestamp)
{
    Q_Q(QScroller);
    const QScrollerPropertiesPrivate *sp = properties.d.data();
    QPointF ppm = q->pixelPerMeter();

    QPointF deltaPixel = position - pressPosition;

    bool moveAborted = false;
    bool moveStarted = (((deltaPixel / ppm).manhattanLength()) > sp->dragStartDistance);

    // check the direction of the mouse drag and abort if it's too much in the wrong direction.
    if (moveStarted) {
        QRectF max = contentPosRange;
        bool canScrollX = (max.width() > 0);
        bool canScrollY = (max.height() > 0);

        if (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollX = true;
        if (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn)
            canScrollY = true;

        if (qAbs(deltaPixel.x() / ppm.x()) < qAbs(deltaPixel.y() / ppm.y())) {
            if (!canScrollY)
                moveAborted = true;
        } else {
            if (!canScrollX)
                moveAborted = true;
        }
    }

    if (moveAborted) {
        setState(QScroller::Inactive);
        moveStarted = false;

    } else if (moveStarted) {
        setState(QScroller::Dragging);

        // subtract the dragStartDistance
        deltaPixel = deltaPixel - deltaPixel * (sp->dragStartDistance / deltaPixel.manhattanLength());

        if (deltaPixel != QPointF(0, 0)) {
            // handleDrag updates lastPosition, lastTimestamp and velocity
            handleDrag(pressPosition + deltaPixel, timestamp);
        }
    }
    return moveStarted;
}